

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

QXmlStreamEntityDeclarations * __thiscall
QXmlStreamReader::entityDeclarations
          (QXmlStreamEntityDeclarations *__return_storage_ptr__,QXmlStreamReader *this)

{
  _Head_base<0UL,_QXmlStreamReaderPrivate_*,_false> this_00;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
  if (*(qsizetype *)((long)&(this_00._M_head_impl)->entityDeclarations + 8) != -1) {
    QXmlStreamReaderPrivate::resolveDtd(this_00._M_head_impl);
  }
  QArrayDataPointer<QXmlStreamEntityDeclaration>::QArrayDataPointer
            (&__return_storage_ptr__->d,&((this_00._M_head_impl)->publicEntityDeclarations).d);
  return __return_storage_ptr__;
}

Assistant:

QXmlStreamEntityDeclarations QXmlStreamReader::entityDeclarations() const
{
    Q_D(const QXmlStreamReader);
    if (d->entityDeclarations.size())
        const_cast<QXmlStreamReaderPrivate *>(d)->resolveDtd();
    return d->publicEntityDeclarations;
}